

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O2

V2f __thiscall Imf_3_4::LatLongMap::pixelPosition(LatLongMap *this,Box2i *dataWindow,V3f *direction)

{
  V2f VVar1;
  V2f local_20;
  
  latLong((LatLongMap *)&local_20,direction);
  VVar1 = pixelPosition(dataWindow,&local_20);
  return VVar1;
}

Assistant:

V2f
pixelPosition (const Box2i& dataWindow, const V3f& direction)
{
    return pixelPosition (dataWindow, latLong (direction));
}